

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_function-c.cpp
# Opt level: O1

void duckdb_table_function_set_extra_info
               (duckdb_table_function function,void *extra_info,duckdb_delete_callback_t destroy)

{
  TableFunctionInfo *pTVar1;
  
  if (function != (duckdb_table_function)0x0) {
    pTVar1 = duckdb::shared_ptr<duckdb::TableFunctionInfo,_true>::operator->
                       ((shared_ptr<duckdb::TableFunctionInfo,_true> *)(function + 0x1a0));
    pTVar1[5]._vptr_TableFunctionInfo = (_func_int **)extra_info;
    pTVar1[6]._vptr_TableFunctionInfo = (_func_int **)destroy;
  }
  return;
}

Assistant:

void duckdb_table_function_set_extra_info(duckdb_table_function function, void *extra_info,
                                          duckdb_delete_callback_t destroy) {
	if (!function) {
		return;
	}
	auto &tf = GetCTableFunction(function);
	auto &info = tf.function_info->Cast<duckdb::CTableFunctionInfo>();
	info.extra_info = extra_info;
	info.delete_callback = destroy;
}